

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::JavaDocCommentTest_Escaping_Test::
JavaDocCommentTest_Escaping_Test(JavaDocCommentTest_Escaping_Test *this)

{
  JavaDocCommentTest_Escaping_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__JavaDocCommentTest_Escaping_Test_02a081c0;
  return;
}

Assistant:

TEST(JavaDocCommentTest, Escaping) {
  EXPECT_EQ("foo /&#42; bar *&#47; baz", EscapeJavadoc("foo /* bar */ baz"));
  EXPECT_EQ("foo /&#42;&#47; baz", EscapeJavadoc("foo /*/ baz"));
  EXPECT_EQ("{&#64;foo}", EscapeJavadoc("{@foo}"));
  EXPECT_EQ("&lt;i&gt;&amp;&lt;/i&gt;", EscapeJavadoc("<i>&</i>"));
  EXPECT_EQ("foo&#92;u1234bar", EscapeJavadoc("foo\\u1234bar"));
  EXPECT_EQ("&#64;deprecated", EscapeJavadoc("@deprecated"));
}